

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorBase<slang::IntervalMapDetails::Path::Entry> * __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pEVar6;
  undefined8 uVar7;
  long lVar8;
  size_type sVar9;
  pointer pEVar10;
  
  if (this == rhs) {
    return this;
  }
  pEVar10 = rhs->data_;
  if (pEVar10 != (pointer)rhs->firstElement) {
    if (this->data_ != (pointer)this->firstElement) {
      operator_delete(this->data_);
      pEVar10 = rhs->data_;
    }
    rhs->data_ = (pointer)0x0;
    this->data_ = pEVar10;
    sVar9 = rhs->len;
    rhs->len = 0;
    this->len = sVar9;
    sVar9 = rhs->cap;
    rhs->cap = 0;
    this->cap = sVar9;
    return this;
  }
  uVar3 = this->len;
  uVar4 = rhs->len;
  if (uVar3 < uVar4) {
    if (this->cap < uVar4) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (uVar3 != 0) {
      memmove(this->data_,pEVar10,uVar3 << 4);
    }
    sVar5 = rhs->len;
    sVar9 = this->len;
    if (sVar9 == sVar5) goto LAB_0061b63e;
    pEVar10 = rhs->data_;
    pEVar6 = this->data_;
    lVar8 = sVar9 << 4;
    do {
      puVar1 = (undefined8 *)((long)&pEVar10->node + lVar8);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pEVar6->node + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      lVar8 = lVar8 + 0x10;
    } while (sVar5 << 4 != lVar8);
  }
  else {
    if (uVar4 == 0) {
      sVar9 = 0;
      goto LAB_0061b63e;
    }
    memmove(this->data_,pEVar10,uVar4 << 4);
  }
  sVar9 = rhs->len;
LAB_0061b63e:
  this->len = sVar9;
  rhs->len = 0;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}